

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O0

ScaleParameter * __thiscall caffe::LayerParameter::mutable_scale_param(LayerParameter *this)

{
  ScaleParameter *this_00;
  LayerParameter *this_local;
  
  set_has_scale_param(this);
  if (this->scale_param_ == (ScaleParameter *)0x0) {
    this_00 = (ScaleParameter *)operator_new(0x38);
    ScaleParameter::ScaleParameter(this_00);
    this->scale_param_ = this_00;
  }
  return this->scale_param_;
}

Assistant:

inline ::caffe::ScaleParameter* LayerParameter::mutable_scale_param() {
  set_has_scale_param();
  if (scale_param_ == NULL) {
    scale_param_ = new ::caffe::ScaleParameter;
  }
  // @@protoc_insertion_point(field_mutable:caffe.LayerParameter.scale_param)
  return scale_param_;
}